

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_type_init(parser_info *info,char **attr)

{
  int iVar1;
  char *pcVar2;
  coda_type_text *pcVar3;
  char **attr_local;
  parser_info *info_local;
  
  pcVar2 = get_attribute_value(attr,"name");
  if (pcVar2 == (char *)0x0) {
    iVar1 = handle_format_attribute_for_type(info,attr);
    if (iVar1 == 0) {
      info->node->free_data = coda_type_release;
      pcVar3 = coda_type_text_new(info->node->format);
      info->node->data = pcVar3;
      if (info->node->data == (void *)0x0) {
        info_local._4_4_ = -1;
      }
      else {
        register_type_elements(info->node,cd_type_set_type);
        register_sub_element
                  (info->node,element_cd_description,string_data_init,type_set_description);
        register_sub_element(info->node,element_cd_attribute,cd_attribute_init,type_add_attribute);
        iVar1 = handle_xml_name(info,attr);
        if (iVar1 == 0) {
          info_local._4_4_ = 0;
        }
        else {
          info_local._4_4_ = -1;
        }
      }
    }
    else {
      info_local._4_4_ = -1;
    }
  }
  else {
    coda_set_error(-400,"attribute \'name\' not allowed for Type");
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

static int cd_type_init(parser_info *info, const char **attr)
{
    if (get_attribute_value(attr, "name") != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'name' not allowed for Type");
        return -1;
    }
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    /* create dummy type where a description and attributes can be stored */
    info->node->data = coda_type_text_new(info->node->format);
    if (info->node->data == NULL)
    {
        return -1;
    }
    register_type_elements(info->node, cd_type_set_type);
    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_attribute, cd_attribute_init, type_add_attribute);

    if (handle_xml_name(info, attr) != 0)
    {
        return -1;
    }

    return 0;
}